

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O2

bool set_sigalg_prefs(Array<unsigned_short> *out,Span<const_unsigned_short> prefs)

{
  unsigned_short *puVar1;
  uint16_t sigalg;
  size_t sVar2;
  bool bVar3;
  SSL_SIGNATURE_ALGORITHM *pSVar4;
  ulong new_size;
  ulong uVar5;
  long lVar6;
  Array<unsigned_short> filtered;
  
  new_size = prefs.size_;
  if (new_size < 2) {
LAB_0022e155:
    filtered.data_ = (unsigned_short *)0x0;
    filtered.size_ = 0;
    bVar3 = bssl::Array<unsigned_short>::InitUninitialized(&filtered,new_size);
    sVar2 = filtered.size_;
    puVar1 = filtered.data_;
    if (bVar3) {
      uVar5 = 0;
      for (lVar6 = 0; new_size * 2 != lVar6; lVar6 = lVar6 + 2) {
        sigalg = *(uint16_t *)((long)prefs.data_ + lVar6);
        if (sigalg != 0xff01) {
          pSVar4 = bssl::get_signature_algorithm(sigalg);
          if (pSVar4 == (SSL_SIGNATURE_ALGORITHM *)0x0) {
            bVar3 = false;
            ERR_put_error(0x10,0,0x127,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                          ,0x233);
            goto LAB_0022e23e;
          }
          if (sVar2 <= uVar5) goto LAB_0022e257;
          puVar1[uVar5] = sigalg;
          uVar5 = uVar5 + 1;
        }
      }
      if (sVar2 < uVar5) {
LAB_0022e257:
        abort();
      }
      filtered.size_ = uVar5;
      if (uVar5 == 0 && new_size != 0) {
        bVar3 = false;
        ERR_put_error(0x10,0,0x127,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                      ,0x23f);
      }
      else {
        bVar3 = true;
        bssl::Array<unsigned_short>::operator=(out,&filtered);
      }
    }
    else {
      bVar3 = false;
    }
LAB_0022e23e:
    bssl::Array<unsigned_short>::~Array(&filtered);
  }
  else {
    filtered.data_ = (unsigned_short *)0x0;
    filtered.size_ = 0;
    bVar3 = bssl::Array<unsigned_short>::CopyFrom(&filtered,prefs);
    if (bVar3) {
      std::__sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>
                (filtered.data_,filtered.data_ + filtered.size_);
      uVar5 = 1;
      do {
        if (filtered.size_ <= uVar5) {
          bssl::Array<unsigned_short>::~Array(&filtered);
          goto LAB_0022e155;
        }
        lVar6 = uVar5 - 1;
        puVar1 = filtered.data_ + uVar5;
        uVar5 = uVar5 + 1;
      } while (filtered.data_[lVar6] != *puVar1);
      ERR_put_error(0x10,0,0x128,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0x217);
    }
    bssl::Array<unsigned_short>::~Array(&filtered);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool set_sigalg_prefs(Array<uint16_t> *out, Span<const uint16_t> prefs) {
  if (!sigalgs_unique(prefs)) {
    return false;
  }

  // Check for invalid algorithms, and filter out |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  Array<uint16_t> filtered;
  if (!filtered.InitForOverwrite(prefs.size())) {
    return false;
  }
  size_t added = 0;
  for (uint16_t pref : prefs) {
    if (pref == SSL_SIGN_RSA_PKCS1_MD5_SHA1) {
      // Though not intended to be used with this API, we treat
      // |SSL_SIGN_RSA_PKCS1_MD5_SHA1| as a real signature algorithm in
      // |SSL_PRIVATE_KEY_METHOD|. Not accepting it here makes for a confusing
      // abstraction.
      continue;
    }
    if (get_signature_algorithm(pref) == nullptr) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
      return false;
    }
    filtered[added] = pref;
    added++;
  }
  filtered.Shrink(added);

  // This can happen if |prefs| contained only |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  // Leaving it empty would revert to the default, so treat this as an error
  // condition.
  if (!prefs.empty() && filtered.empty()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
    return false;
  }

  *out = std::move(filtered);
  return true;
}